

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::Directed_Energy_Fire_PDU
          (Directed_Energy_Fire_PDU *this,EntityIdentifier *FireID,EntityIdentifier *EventID,
          EntityType *MunitionType,ClockTime *ShotStartTime,KFLOAT32 CumulativeShotTime,
          Vector *EmitterLocation,KFLOAT32 ApertureDiameter,KFLOAT32 Wavelength,
          KFLOAT32 PeakIrradiance,KFLOAT32 PulseRepetitionFrequency,KFLOAT32 PulseWidth,
          KBOOL WeaponState,KBOOL UpdateState,BeamSpotShape PS)

{
  KBOOL UpdateState_local;
  KBOOL WeaponState_local;
  KFLOAT32 PulseWidth_local;
  KFLOAT32 PulseRepetitionFrequency_local;
  KFLOAT32 PeakIrradiance_local;
  KFLOAT32 Wavelength_local;
  KFLOAT32 ApertureDiameter_local;
  Vector *EmitterLocation_local;
  KFLOAT32 CumulativeShotTime_local;
  ClockTime *ShotStartTime_local;
  EntityType *MunitionType_local;
  EntityIdentifier *EventID_local;
  EntityIdentifier *FireID_local;
  Directed_Energy_Fire_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Directed_Energy_Fire_PDU_003305a8;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_FiringEntityID,FireID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID,EventID);
  DATA_TYPE::EntityType::EntityType(&this->m_MunTyp,MunitionType);
  DATA_TYPE::ClockTime::ClockTime(&this->m_ShotStartTime,ShotStartTime);
  this->m_f32CumulativeShotTime = CumulativeShotTime;
  DATA_TYPE::Vector::Vector(&this->m_EmitterLoc,EmitterLocation);
  this->m_f32AperDiameter = ApertureDiameter;
  this->m_f32Wavelength = Wavelength;
  this->m_f32PeakIrradiance = PeakIrradiance;
  this->m_f32PulseRepFreq = PulseRepetitionFrequency;
  this->m_f32PulseWidth = PulseWidth;
  this->m_ui8PulseShp = (KUINT8)PS;
  this->m_ui8Padding1 = '\0';
  this->m_ui32Padding2 = 0;
  this->m_ui16Padding3 = 0;
  this->m_ui16NumDERecs = 0;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::vector(&this->m_vDeRec);
  (this->super_Header).super_Header6.m_ui8PDUType = 'D';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x58;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x02';
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\a';
  (this->m_DeUnion).m_ui16Flags = (this->m_DeUnion).m_ui16Flags & 0xfffe | (ushort)WeaponState;
  (this->m_DeUnion).m_ui16Flags = (this->m_DeUnion).m_ui16Flags & 0xfffd | (ushort)UpdateState << 1;
  return;
}

Assistant:

Directed_Energy_Fire_PDU::Directed_Energy_Fire_PDU( const EntityIdentifier & FireID, const EntityIdentifier & EventID,
                                                    const EntityType & MunitionType, const ClockTime & ShotStartTime,
                                                    KFLOAT32 CumulativeShotTime, const Vector & EmitterLocation,
                                                    KFLOAT32 ApertureDiameter, KFLOAT32 Wavelength, KFLOAT32 PeakIrradiance,
                                                    KFLOAT32 PulseRepetitionFrequency, KFLOAT32 PulseWidth,
                                                    KBOOL WeaponState, KBOOL UpdateState, BeamSpotShape PS ) :
    m_FiringEntityID( FireID ),
    m_EventID( EventID ),
    m_MunTyp( MunitionType ),
    m_ShotStartTime( ShotStartTime ),
    m_f32CumulativeShotTime( CumulativeShotTime ),
    m_EmitterLoc( EmitterLocation ),
    m_f32AperDiameter( ApertureDiameter ),
    m_f32Wavelength( Wavelength ),
    m_f32PeakIrradiance( PeakIrradiance ),
    m_f32PulseRepFreq( PulseRepetitionFrequency ),
    m_f32PulseWidth( PulseWidth ),
    m_ui8PulseShp( PS ),
    m_ui8Padding1( 0 ),
    m_ui32Padding2( 0 ),
    m_ui16Padding3( 0 ),
    m_ui16NumDERecs( 0 )
{
    m_ui8PDUType = DirectedEnergyFire_PDU_Type;
    m_ui16PDULength = DIRECTED_ENERGY_PDU_SIZE;
    m_ui8ProtocolFamily = Warfare;
    m_ui8ProtocolVersion = IEEE_1278_1_2012;
    m_DeUnion.m_ui16WeaponState = WeaponState;
    m_DeUnion.m_ui16StateUpdate = UpdateState;
}